

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentFactoredStates.cpp
# Opt level: O2

Index __thiscall
MADPComponentFactoredStates::FactorValueIndicesToStateIndex
          (MADPComponentFactoredStates *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *s_e_vec,Scope *sfSC)

{
  Index IVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nr_sf_e;
  allocator_type local_39;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_38,
             (long)(sfSC->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(sfSC->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2,&local_39);
  IndexTools::RestrictIndividualIndicesToScope<unsigned_long>
            (&this->_m_sfacDomainSizes,sfSC,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_38);
  IVar1 = IndexTools::IndividualToJointIndices
                    (s_e_vec,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_38);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_38);
  return IVar1;
}

Assistant:

Index MADPComponentFactoredStates::
FactorValueIndicesToStateIndex(const vector<Index>& s_e_vec, 
        const Scope& sfSC) const
{
    vector<size_t> nr_sf_e(sfSC.size());
    IndexTools::RestrictIndividualIndicesToScope(
        _m_sfacDomainSizes, sfSC, nr_sf_e);
    Index sI_e = IndexTools::IndividualToJointIndices( s_e_vec, nr_sf_e);
    return(sI_e);
}